

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

size_t MyWrite(void *pp,void *data,size_t size)

{
  if (*(ulong *)((long)pp + 0x10) < size) {
    *(undefined4 *)((long)pp + 0x18) = 1;
    size = *(ulong *)((long)pp + 0x10);
  }
  memcpy(*(void **)((long)pp + 8),data,size);
  *(long *)((long)pp + 0x10) = *(long *)((long)pp + 0x10) - size;
  *(long *)((long)pp + 8) = *(long *)((long)pp + 8) + size;
  return size;
}

Assistant:

static size_t MyWrite(void *pp, const void *data, size_t size)
{
  CSeqOutStreamBuf *p = (CSeqOutStreamBuf *)pp;
  if (p->rem < size)
  {
    size = p->rem;
    p->overflow = True;
  }
  memcpy(p->data, data, size);
  p->rem -= size;
  p->data += size;
  return size;
}